

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O1

void __thiscall Wasm::WasmBinaryReader::ReadFunctionSignatures(WasmBinaryReader *this)

{
  uint uVar1;
  uint32 uVar2;
  uint index;
  WasmSignature *sig;
  char16_t *msg;
  WebAssemblyModule *this_00;
  uint32 local_2c [2];
  uint32 len;
  
  local_2c[0] = 0;
  uVar1 = LEB128<unsigned_int,32u>(this,local_2c);
  this_00 = this->m_module;
  uVar2 = Js::WebAssemblyModule::GetWasmFunctionCount(this_00);
  if ((!CARRY4(uVar2,uVar1)) && ((uVar2 + uVar1 < 0xf4241 || (DAT_015aa2e2 != '\0')))) {
    if (uVar1 != 0) {
      do {
        index = LEB128<unsigned_int,32u>(this,local_2c);
        this_00 = this->m_module;
        uVar2 = Js::WebAssemblyModule::GetSignatureCount(this_00);
        if (uVar2 <= index) {
          msg = L"Function signature is out of bound";
          goto LAB_00f2570c;
        }
        sig = Js::WebAssemblyModule::GetSignature(this->m_module,index);
        Js::WebAssemblyModule::AddWasmFunctionInfo(this->m_module,sig);
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    return;
  }
  msg = L"Too many functions";
LAB_00f2570c:
  ThrowDecodingError((WasmBinaryReader *)this_00,msg);
}

Assistant:

void WasmBinaryReader::ReadFunctionSignatures()
{
    uint32 len = 0;
    uint32 nFunctions = LEB128(len);

    uint32 totalFunctions = 0;
    if (UInt32Math::Add(nFunctions, m_module->GetWasmFunctionCount(), &totalFunctions) || totalFunctions > Limits::GetMaxFunctions())
    {
        ThrowDecodingError(_u("Too many functions"));
    }

    for (uint32 iFunc = 0; iFunc < nFunctions; iFunc++)
    {
        uint32 sigIndex = LEB128(len);
        if (sigIndex >= m_module->GetSignatureCount())
        {
            ThrowDecodingError(_u("Function signature is out of bound"));
        }

        WasmSignature* sig = m_module->GetSignature(sigIndex);
        m_module->AddWasmFunctionInfo(sig);
    }
}